

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

size_t __thiscall
llama_context::state_seq_get_data(llama_context *this,llama_seq_id seq_id,uint8_t *dst,size_t size)

{
  size_t sVar1;
  llama_io_write_buffer io;
  
  io.super_llama_io_write_i._vptr_llama_io_write_i = (_func_int **)&PTR__llama_io_write_i_002cd4e0;
  io.size_written = 0;
  io.ptr = dst;
  io.buf_size = size;
  sVar1 = state_seq_write_data(this,&io.super_llama_io_write_i,seq_id);
  return sVar1;
}

Assistant:

size_t llama_context::state_seq_get_data(llama_seq_id seq_id, uint8_t * dst, size_t size) {
    llama_io_write_buffer io(dst, size);
    try {
        return state_seq_write_data(io, seq_id);
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: error saving state: %s\n", __func__, err.what());
        return 0;
    }
}